

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O0

iterator __thiscall
ImVector<ImGuiStorage::Pair>::insert
          (ImVector<ImGuiStorage::Pair> *this,const_iterator it,value_type *v)

{
  bool bVar1;
  undefined4 uVar2;
  long lVar3;
  Pair *pPVar4;
  int local_3c;
  ptrdiff_t off;
  value_type *v_local;
  const_iterator it_local;
  ImVector<ImGuiStorage::Pair> *this_local;
  
  bVar1 = false;
  if (this->Data <= it) {
    bVar1 = it <= this->Data + this->Size;
  }
  if (!bVar1) {
    __assert_fail("it >= Data && it <= Data+Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui.h"
                  ,0x3ab,
                  "iterator ImVector<ImGuiStorage::Pair>::insert(const_iterator, const value_type &) [T = ImGuiStorage::Pair]"
                 );
  }
  lVar3 = (long)it - (long)this->Data >> 4;
  if (this->Size == this->Capacity) {
    if (this->Capacity == 0) {
      local_3c = 4;
    }
    else {
      local_3c = this->Capacity << 1;
    }
    reserve(this,local_3c);
  }
  if (lVar3 < this->Size) {
    memmove(this->Data + lVar3 + 1,this->Data + lVar3,(this->Size - lVar3) * 0x10);
  }
  pPVar4 = this->Data + lVar3;
  uVar2 = *(undefined4 *)&v->field_0x4;
  pPVar4->key = v->key;
  *(undefined4 *)&pPVar4->field_0x4 = uVar2;
  pPVar4->field_1 = v->field_1;
  this->Size = this->Size + 1;
  return this->Data + lVar3;
}

Assistant:

inline iterator             insert(const_iterator it, const value_type& v)  { IM_ASSERT(it >= Data && it <= Data+Size); const ptrdiff_t off = it - Data; if (Size == Capacity) reserve(Capacity ? Capacity * 2 : 4); if (off < (int)Size) memmove(Data + off + 1, Data + off, ((size_t)Size - (size_t)off) * sizeof(value_type)); Data[off] = v; Size++; return Data + off; }